

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::buildMetrics(NavierStokesBase *this)

{
  long lVar1;
  BoxArray *area;
  Geometry *this_00;
  Real *pRVar2;
  Print *msg;
  FabFactory<amrex::FArrayBox> *pFVar3;
  long lVar4;
  MultiFab *pMVar5;
  long in_RDI;
  char *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  EBFArrayBoxFactory *ebfactory;
  int i;
  Real *dx;
  int dir;
  char (*x) [6];
  AmrLevel *in_stack_fffffffffffffd20;
  Print *in_stack_fffffffffffffd48;
  Print *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd60;
  Geometry *in_stack_fffffffffffffd68;
  MultiFab *in_stack_fffffffffffffd70;
  int dir_00;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffd80;
  Print *in_stack_fffffffffffffd90;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  int local_8c;
  char local_80 [8];
  undefined1 local_78 [120];
  
  amrex::FabArray<amrex::FArrayBox>::clear(in_stack_fffffffffffffd60);
  local_78._80_8_ = 0;
  local_78._88_8_ = 0;
  local_78._64_8_ = 0;
  local_78._72_8_ = 0;
  local_78._96_8_ = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x514ecf);
  local_78._56_8_ = 0;
  x = (char (*) [6])(local_78 + 0x38);
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffd20);
  amrex::MultiFab::define
            (in_stack_fffffffffffffd70,(BoxArray *)in_stack_fffffffffffffd68,
             (DistributionMapping *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),(int)in_stack_fffffffffffffd58,
             (MFInfo *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd80);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x514f3b);
  amrex::MFInfo::~MFInfo((MFInfo *)0x514f48);
  amrex::Geometry::GetVolume(in_stack_fffffffffffffd68,(MultiFab *)in_stack_fffffffffffffd60);
  for (local_78._40_4_ = 0; (int)local_78._40_4_ < 3; local_78._40_4_ = local_78._40_4_ + 1) {
    amrex::FabArray<amrex::FArrayBox>::clear(in_stack_fffffffffffffd60);
    lVar1 = (long)(int)local_78._40_4_ * 0x180;
    lVar4 = in_RDI + 0x540 + lVar1;
    area = amrex::AmrLevel::getEdgeBoxArray(in_stack_fffffffffffffd20,(int)((ulong)x >> 0x20));
    this_00 = (Geometry *)(in_RDI + 0x140);
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_78._8_8_ = (ostream *)0x0;
    local_78._32_8_ = 0;
    in_stack_fffffffffffffd90 = (Print *)local_78;
    amrex::MFInfo::MFInfo((MFInfo *)0x51501e);
    local_80[0] = '\0';
    local_80[1] = '\0';
    local_80[2] = '\0';
    local_80[3] = '\0';
    local_80[4] = '\0';
    local_80[5] = '\0';
    local_80[6] = '\0';
    local_80[7] = '\0';
    x = (char (*) [6])local_80;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffd20);
    (**(code **)(*(long *)(in_RDI + 0x540 + lVar1) + 0x10))
              (lVar4,area,this_00,1,1,in_stack_fffffffffffffd90);
    dir_00 = (int)((ulong)lVar4 >> 0x20);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x51508e);
    amrex::MFInfo::~MFInfo((MFInfo *)0x51509b);
    amrex::Geometry::GetFaceArea(this_00,(MultiFab *)area,dir_00);
  }
  this_01 = (char *)(in_RDI + 0x10);
  pRVar2 = amrex::CoordSys::CellSize((CoordSys *)this_01);
  for (local_8c = 1; local_8c < 3; local_8c = local_8c + 1) {
    std::abs((int)this_01);
    if (*pRVar2 * 1e-12 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
        (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != *pRVar2 * 1e-12) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffffd50,(ostream *)in_stack_fffffffffffffd48);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffffd20,x);
      in_stack_fffffffffffffd50 =
           amrex::Print::operator<<((Print *)in_stack_fffffffffffffd20,(double *)x);
      in_stack_fffffffffffffd48 =
           amrex::Print::operator<<((Print *)in_stack_fffffffffffffd20,(char (*) [2])x);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffffd20,(double *)x);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffffd20,(char (*) [2])x);
      msg = amrex::Print::operator<<((Print *)in_stack_fffffffffffffd20,(double *)x);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffffd20,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)x);
      amrex::Print::~Print(in_stack_fffffffffffffd90);
      local_78._112_8_ = "EB requires dx == dy (== dz)\n";
      this_01 = "EB requires dx == dy (== dz)\n";
      amrex::Abort_host((char *)msg);
    }
  }
  pFVar3 = amrex::AmrLevel::Factory(in_stack_fffffffffffffd20);
  lVar4 = __dynamic_cast(pFVar3,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                         &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar4 == 0) {
    __cxa_bad_cast();
  }
  pMVar5 = amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffffd20);
  *(MultiFab **)(in_RDI + 0x9c0) = pMVar5;
  amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffffd20);
  *(undefined8 *)(in_RDI + 0xb50) = local_238;
  *(undefined8 *)(in_RDI + 0xb58) = local_230;
  *(undefined8 *)(in_RDI + 0xb60) = local_228;
  return;
}

Assistant:

void
NavierStokesBase::buildMetrics ()
{
    //
    // We "should" only need radius when we're RZ, but some 2-D code is written to
    // access it first and then "use" if if RZ.  It's easier to just always build
    // it for 2D than try to fix the underlying Fortran calls that take radius.
    //
#if (AMREX_SPACEDIM == 2)
    radius.resize(grids.size());

    const Real dxr = geom.CellSize()[0];

    for (int i = 0; i < grids.size(); i++)
    {
        const int ilo = grids[i].smallEnd(0)-radius_grow;
        const int ihi = grids[i].bigEnd(0)+radius_grow;
        const int len = ihi - ilo + 1;

        radius[i].resize(len);

        RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());

        const Real xlo = gridloc.lo(0) + (0.5 - radius_grow)*dxr;
        for (int j = 0; j < len; j++) {
            radius[i][j] = xlo + j*dxr;
        }
    }
#endif

    // volume and area are intentionally without EB knowledge
    volume.clear();
    volume.define(grids,dmap,1,GEOM_GROW);
    geom.GetVolume(volume);

    for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
    {
        area[dir].clear();
        area[dir].define(getEdgeBoxArray(dir),dmap,1,GEOM_GROW);
        geom.GetFaceArea(area[dir],dir);
    }

#ifdef AMREX_USE_EB
    // make sure dx == dy == dz
    const Real* dx = geom.CellSize();
    for (int i = 1; i < AMREX_SPACEDIM; i++){
        if (std::abs(dx[i]-dx[i-1]) > 1.e-12*dx[0]){
            Print()<<"dx = "
                   <<AMREX_D_TERM(dx[0], <<" "<<dx[1], <<" "<<dx[2])
                   <<std::endl;
            amrex::Abort("EB requires dx == dy (== dz)\n");
        }
    }

    const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
    volfrac = &(ebfactory.getVolFrac());
    areafrac = ebfactory.getAreaFrac();

#endif
}